

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClauseCodeTree.cpp
# Opt level: O1

bool __thiscall
Indexing::ClauseCodeTree::ClauseMatcher::matchGlobalVars(ClauseMatcher *this,int *resolvedQueryLit)

{
  Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled> *pRVar1
  ;
  Recycled<Indexing::ClauseCodeTree::LiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled> *pRVar2
  ;
  MatchInfo *bq;
  MatchInfo *pMVar3;
  LitInfo *pLVar4;
  int *piVar5;
  bool bVar6;
  int iVar7;
  MatchInfo **ppMVar8;
  MatchInfo **ppMVar9;
  ulong uVar10;
  uint uVar11;
  ILStruct *this_00;
  uint uVar12;
  ulong side;
  long lVar13;
  ILStruct *this_01;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  uint matchIndex;
  ulong uVar17;
  bool local_79;
  
  pRVar1 = (this->lms)._cursor;
  pRVar2 = (this->lms)._stack;
  if ((matchGlobalVars(int&)::remaining == '\0') &&
     (iVar7 = __cxa_guard_acquire(&matchGlobalVars(int&)::remaining), iVar7 != 0)) {
    ::Lib::TriangularArray<int>::TriangularArray(&matchGlobalVars::remaining,10);
    __cxa_atexit(::Lib::TriangularArray<int>::~TriangularArray,&matchGlobalVars::remaining,
                 &__dso_handle);
    __cxa_guard_release(&matchGlobalVars(int&)::remaining);
  }
  uVar11 = (int)((ulong)((long)pRVar1 - (long)pRVar2) >> 4) - 1;
  side = (ulong)uVar11;
  ::Lib::TriangularArray<int>::setSide(&matchGlobalVars::remaining,side);
  piVar5 = matchGlobalVars::remaining._data;
  if (uVar11 != 0) {
    pRVar1 = (this->lms)._stack;
    lVar13 = 0;
    do {
      *(undefined4 *)((long)piVar5 + lVar13) =
           *(undefined4 *)
            ((*(ulong *)**(undefined8 **)
                          ((long)&(pRVar1->_self)._M_t.
                                  super___uniq_ptr_impl<Indexing::ClauseCodeTree::LiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::LiteralMatcher>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_Indexing::ClauseCodeTree::LiteralMatcher_*,_std::default_delete<Indexing::ClauseCodeTree::LiteralMatcher>_>
                                  .
                                  super__Head_base<0UL,_Indexing::ClauseCodeTree::LiteralMatcher_*,_false>
                                  ._M_head_impl + lVar13 * 4) >> 3) + 0x34);
      lVar13 = lVar13 + 4;
    } while (side * 4 - lVar13 != 0);
  }
  if (matchGlobalVars(int&)::matchIndex == '\0') {
    matchGlobalVars();
  }
  ::Lib::DArray<int>::ensure(&matchGlobalVars::matchIndex,side);
  local_79 = uVar11 == 0;
  if (local_79) {
LAB_002bdbaf:
    *resolvedQueryLit = -1;
    if ((this->sres == true) && (uVar11 != 0)) {
      lVar13 = 0;
      do {
        ppMVar8 = CodeTree::ILStruct::getMatch
                            ((ILStruct *)
                             (*(ulong *)**(undefined8 **)
                                          ((long)&(((this->lms)._stack)->_self)._M_t.
                                                  super___uniq_ptr_impl<Indexing::ClauseCodeTree::LiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::LiteralMatcher>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_Indexing::ClauseCodeTree::LiteralMatcher_*,_std::default_delete<Indexing::ClauseCodeTree::LiteralMatcher>_>
                                                  .
                                                  super__Head_base<0UL,_Indexing::ClauseCodeTree::LiteralMatcher_*,_false>
                                                  ._M_head_impl + lVar13 * 4) >> 3),
                             *(uint *)((long)matchGlobalVars::matchIndex._array + lVar13));
        pLVar4 = (this->lInfos)._array;
        if (pLVar4[*(uint *)*ppMVar8].opposite == true) {
          *resolvedQueryLit = pLVar4[*(uint *)*ppMVar8].litIndex;
          return local_79;
        }
        lVar13 = lVar13 + 4;
      } while (side << 2 != lVar13);
    }
  }
  else {
    uVar16 = 0;
LAB_002bd9e1:
    matchGlobalVars::matchIndex._array[uVar16] = -1;
    uVar14 = (int)uVar16 + 1;
    uVar17 = uVar16;
    do {
      uVar15 = (int)uVar17 + 1;
      uVar16 = (ulong)uVar15;
      while( true ) {
        uVar12 = matchGlobalVars::matchIndex._array[uVar17] + 1;
        matchGlobalVars::matchIndex._array[uVar17] = uVar12;
        if (uVar12 == *(uint *)((long)matchGlobalVars::remaining._data +
                               uVar17 * 4 +
                               ((matchGlobalVars::remaining._2sideMinus1 - uVar17) * uVar17 &
                               0xfffffffffffffffe) * 2)) break;
        this_01 = (ILStruct *)
                  (**(ulong **)
                     &((this->lms)._stack[uVar17]._self._M_t.
                       super___uniq_ptr_impl<Indexing::ClauseCodeTree::LiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::LiteralMatcher>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Indexing::ClauseCodeTree::LiteralMatcher_*,_std::default_delete<Indexing::ClauseCodeTree::LiteralMatcher>_>
                       .super__Head_base<0UL,_Indexing::ClauseCodeTree::LiteralMatcher_*,_false>.
                      _M_head_impl)->super_Matcher >> 3);
        ppMVar8 = CodeTree::ILStruct::getMatch(this_01,uVar12);
        if (uVar15 < uVar11) {
          bq = *ppMVar8;
          uVar10 = (ulong)uVar14;
          do {
            uVar12 = *(uint *)((long)matchGlobalVars::remaining._data +
                              uVar10 * 4 +
                              ((matchGlobalVars::remaining._2sideMinus1 - uVar17) * uVar17 &
                              0xfffffffffffffffe) * 2);
            if (uVar12 != 0) {
              this_00 = (ILStruct *)
                        (**(ulong **)
                           &((this->lms)._stack[uVar10]._self._M_t.
                             super___uniq_ptr_impl<Indexing::ClauseCodeTree::LiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::LiteralMatcher>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_Indexing::ClauseCodeTree::LiteralMatcher_*,_std::default_delete<Indexing::ClauseCodeTree::LiteralMatcher>_>
                             .
                             super__Head_base<0UL,_Indexing::ClauseCodeTree::LiteralMatcher_*,_false>
                            ._M_head_impl)->super_Matcher >> 3);
              matchIndex = 0;
              do {
                ppMVar8 = CodeTree::ILStruct::getMatch(this_00,matchIndex);
                bVar6 = compatible(this,this_01,bq,this_00,*ppMVar8);
                if (bVar6) {
                  matchIndex = matchIndex + 1;
                }
                else {
                  uVar12 = uVar12 - 1;
                  ppMVar8 = CodeTree::ILStruct::getMatch(this_00,matchIndex);
                  ppMVar9 = CodeTree::ILStruct::getMatch(this_00,uVar12);
                  pMVar3 = *ppMVar8;
                  *ppMVar8 = *ppMVar9;
                  *ppMVar9 = pMVar3;
                }
              } while (matchIndex < uVar12);
            }
            if (uVar12 == 0) {
              iVar7 = 8;
              goto LAB_002bdb74;
            }
            *(uint *)((long)matchGlobalVars::remaining._data +
                     uVar10 * 4 +
                     ((matchGlobalVars::remaining._2sideMinus1 - uVar16) * uVar16 &
                     0xfffffffffffffffe) * 2) = uVar12;
            uVar10 = uVar10 + 1;
          } while (uVar10 < side);
        }
        iVar7 = 9;
LAB_002bdb74:
        if ((iVar7 == 0) || (iVar7 == 9)) {
          local_79 = uVar11 <= uVar15;
          if (!local_79) goto LAB_002bd9e1;
          goto LAB_002bdbaf;
        }
      }
      uVar14 = uVar14 - 1;
      bVar6 = uVar17 != 0;
      uVar17 = uVar17 - 1;
    } while (bVar6);
  }
  return local_79;
}

Assistant:

bool ClauseCodeTree::ClauseMatcher::matchGlobalVars(int& resolvedQueryLit)
{
  //TODO: perform _set_, not _multiset_ subsumption for subsumption resolution

//  bool verbose=query->number()==58746;
//#define VERB_OUT(x) if(verbose) {cout<<x<<endl;}

  unsigned clen=lms.size()-1;

  //remaining[j,0] contains number of matches for j-th index literal
  //remaining[j,i+1] (for j>i) contains number of matches for j-th
  //  index literal compatible with the bindings of i-th literal (and
  //  those before it)
  //remaining[j,j] therefore contains number of matches we have to try
  //  when we get to binding j-th literal
  //  Matches in ILStruct::matches are reordered, so that we always try
  //  the _first_ remaining[j,j] literals
  static TriangularArray<int> remaining(10);
  remaining.setSide(clen);
  for(unsigned j=0;j<clen;j++) {
    ILStruct* ils=lms[j]->getILS();
    remaining.set(j,0,ils->matchCnt);

//    VERB_OUT("matches "<<ils->matches.size()<<" index:"<<j<<" vars:"<<ils->varCnt<<" linfos:"<<lInfos.size());
//    for(unsigned y=0;y<ils->matches.size();y++) {
//      LitInfo* linf=&lInfos[ils->matches[y]->liIndex];
//      VERB_OUT(" match "<<y<<" liIndex:"<<ils->matches[y]->liIndex<<" op: "<<linf->opposite);
//      VERB_OUT(" hdr: "<<(*linf->ft)[0].number());
//    }
//    for(unsigned x=0;x<ils->varCnt;x++) {
//      VERB_OUT(" glob var: "<<ils->sortedGlobalVarNumbers[x]);
//      for(unsigned y=0;y<ils->matches.size();y++) {
//	VERB_OUT(" match "<<y<<" binding: "<<ils->matches[y]->bindings[x]);
//      }
//    }
  }
//  VERB_OUT("secOp:"<<(lms[1]->op-1)->instr()<<" "<<(lms[1]->op-1)->arg());

  static DArray<int> matchIndex;
  matchIndex.ensure(clen);
  unsigned failLev=0;
  for(unsigned i=0;i<clen;i++) {
    matchIndex[i]=-1;
    if(i>0) { failLev=20; }
  bind_next_match:
    matchIndex[i]++;
    if(matchIndex[i]==remaining.get(i,i)) {
      //no more choices at this level, so try going up
      if(i==0) {
	RSTAT_MCTR_INC("zero level fails at", failLev);
	return false;
      }
      i--;
      goto bind_next_match;
    }
    ASS_L(matchIndex[i],remaining.get(i,i));

    ILStruct* bi=lms[i]->getILS(); 		//bound index literal
    MatchInfo* bq=bi->getMatch(matchIndex[i]);	//bound query literal

    //propagate the implications of this binding to next literals
    for(unsigned j=i+1;j<clen;j++) {
      ILStruct* ni=lms[j]->getILS();		//next index literal
      unsigned rem=remaining.get(j,i);
      unsigned k=0;
      while(k<rem) {
	MatchInfo* nq=ni->getMatch(k);		//next query literal
	if(!compatible(bi,bq,ni,nq)) {
	  rem--;
	  swap(ni->getMatch(k),ni->getMatch(rem));
	  continue;
	}
	k++;
      }
      if(rem==0) {
	if(failLev<j) { failLev=j; }
	goto bind_next_match;
      }
      remaining.set(j,i+1,rem);
    }
  }

  resolvedQueryLit=-1;
  if(sres) {
    for(unsigned i=0;i<clen;i++) {
      ILStruct* ils=lms[i]->getILS();
      MatchInfo* mi=ils->getMatch(matchIndex[i]);
      if(lInfos[mi->liIndex].opposite) {
	resolvedQueryLit=lInfos[mi->liIndex].litIndex;
	break;
      }
    }
  }

  return true;
}